

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void envy_bios_print(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  envy_bios_hwea_entry *peVar4;
  uint end;
  uint start;
  uint last;
  int i_2;
  envy_bios_hwea_entry *entry;
  int local_28;
  int j_1;
  int i_1;
  int j;
  int i;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  print_pcir(bios,out,mask);
  switch(bios->type) {
  case ENVY_BIOS_TYPE_UNKNOWN:
    if ((mask & 2) != 0) {
      fprintf((FILE *)out,"BIOS type: UNKNOWN!\n\n");
    }
    break;
  case ENVY_BIOS_TYPE_NV01:
    if ((mask & 2) != 0) {
      fprintf((FILE *)out,"BIOS type: NV01\n\n");
    }
    if ((mask & 0x80) != 0) {
      fprintf((FILE *)out,"Pre-mem scripts:\n\n");
      print_nv01_init_script(bios,out,0x17bc,mask);
      print_nv01_init_script(bios,out,0x17a2,mask);
      print_nv01_init_script(bios,out,0x18f4,mask);
      fprintf((FILE *)out,"1MB script:\n\n");
      print_nv01_init_script(bios,out,0x199a,mask);
      fprintf((FILE *)out,"2MB script:\n\n");
      print_nv01_init_script(bios,out,0x19db,mask);
      fprintf((FILE *)out,"4MB script:\n\n");
      print_nv01_init_script(bios,out,0x1a1c,mask);
      fprintf((FILE *)out,"Post-mem scripts:\n\n");
      print_nv01_init_script(bios,out,0x198d,mask);
      print_nv01_init_script(bios,out,0x1929,mask);
      fprintf((FILE *)out,"Unknown scripts:\n\n");
      print_nv01_init_script(bios,out,0x184f,mask);
    }
    break;
  case ENVY_BIOS_TYPE_NV03:
    if ((mask & 2) != 0) {
      fprintf((FILE *)out,"BIOS type: NV03\n\n");
    }
    if ((mask & 4) != 0) {
      fprintf((FILE *)out,"Subsystem id: 0x%04x:0x%04x\n",(ulong)bios->subsystem_vendor,
              (ulong)bios->subsystem_device);
      envy_bios_dump_hex(bios,out,0x54,4,mask);
      fprintf((FILE *)out,"\n");
    }
    print_bmp_nv03(bios,out,mask);
    if (bios->init_script != 0) {
      print_nv01_init_script(bios,out,(uint)bios->init_script,mask);
    }
    break;
  case ENVY_BIOS_TYPE_NV04:
    if ((mask & 2) != 0) {
      fprintf((FILE *)out,"BIOS type: NV04\n\n");
    }
    if ((mask & 4) != 0) {
      fprintf((FILE *)out,"Subsystem id: 0x%04x:0x%04x\n",(ulong)bios->subsystem_vendor,
              (ulong)bios->subsystem_device);
      envy_bios_dump_hex(bios,out,0x54,4,mask);
      if (bios->hwinfo_ext_valid != '\0') {
        fprintf((FILE *)out,"Straps 0: select 0x%08x value 0x%08x\n",(ulong)bios->straps0_select,
                (ulong)bios->straps0_value);
        fprintf((FILE *)out,"Straps 1: select 0x%08x value 0x%08x\n",(ulong)bios->straps1_select,
                (ulong)bios->straps1_value);
        envy_bios_dump_hex(bios,out,0x58,0x14,mask);
        for (i_1 = 0; i_1 < bios->mmioinitsnum; i_1 = i_1 + 1) {
          fprintf((FILE *)out,"Addr 0x%08x len %d\n",(ulong)bios->mmioinits[i_1].addr,
                  (ulong)bios->mmioinits[i_1].len);
          for (j_1 = 0; (uint)j_1 < bios->mmioinits[i_1].len; j_1 = j_1 + 1) {
            fprintf((FILE *)out,"\tR[0x%08x] <= 0x%08x\n",
                    (ulong)(bios->mmioinits[i_1].addr + j_1 * 4),
                    (ulong)bios->mmioinits[i_1].data[j_1]);
          }
        }
        envy_bios_dump_hex(bios,out,bios->mmioinit_offset,bios->mmioinit_len,mask);
      }
      fprintf((FILE *)out,"\n");
      if (bios->hwea_offset != 0) {
        fprintf((FILE *)out,"HWEA at 0x%04x:\n",(ulong)bios->hwea_offset);
        for (local_28 = 0; local_28 < bios->hwea_entriesnum; local_28 = local_28 + 1) {
          peVar4 = bios->hwea_entries + local_28;
          if (bios->hwea_version == 0) {
            for (entry._4_4_ = 0; entry._4_4_ < peVar4->len; entry._4_4_ = entry._4_4_ + 1) {
              fprintf((FILE *)out,"\t");
              if (peVar4->type == '\0') {
                fprintf((FILE *)out,"C");
              }
              else if (peVar4->type == '\x01') {
                fprintf((FILE *)out,"D");
              }
              else {
                fprintf((FILE *)out,"UNK%02X",(ulong)peVar4->type);
              }
              fprintf((FILE *)out,"[0x%04x] <= 0x%08x\n",(ulong)(peVar4->base + entry._4_4_ * 4),
                      (ulong)peVar4->data[(int)entry._4_4_]);
            }
          }
          else if (peVar4->type < 2) {
            for (entry._4_4_ = 0; entry._4_4_ < peVar4->len; entry._4_4_ = entry._4_4_ + 1) {
              fprintf((FILE *)out,"\tR[0x%06x] <= 0x%08x\n",
                      (ulong)(peVar4->base +
                             entry._4_4_ * 4 * (uint)((peVar4->type != '\0' ^ 0xffU) & 1)),
                      (ulong)peVar4->data[(int)entry._4_4_]);
            }
          }
          else {
            fprintf((FILE *)out,"\tR[0x%06x] &= 0x%08x |= 0x%08x\n",(ulong)peVar4->base,
                    (ulong)*peVar4->data,(ulong)peVar4->data[1]);
          }
        }
        envy_bios_dump_hex(bios,out,bios->hwea_offset,bios->hwea_len,mask);
        fprintf((FILE *)out,"\n");
      }
    }
    envy_bios_print_bit(bios,_stdout,mask);
    envy_bios_print_info(bios,_stdout,mask);
    envy_bios_print_bit_P(bios,_stdout,mask);
    envy_bios_print_bit_M(bios,_stdout,mask);
    envy_bios_print_bit_D(bios,_stdout,mask);
    envy_bios_print_bit_L(bios,_stdout,mask);
    envy_bios_print_bit_T(bios,_stdout,mask);
    envy_bios_print_bit_d(bios,_stdout,mask);
    envy_bios_print_bit_p(bios,_stdout,mask);
    envy_bios_print_dacload(bios,_stdout,mask);
    envy_bios_print_iunk21(bios,_stdout,mask);
    envy_bios_print_i2cscript(bios,_stdout,mask);
    envy_bios_print_dcb(bios,_stdout,mask);
    envy_bios_print_odcb(bios,_stdout,mask);
    envy_bios_print_i2c(bios,_stdout,mask);
    envy_bios_print_gpio(bios,_stdout,mask);
    envy_bios_print_inputdev(bios,_stdout,mask);
    envy_bios_print_cinema(bios,_stdout,mask);
    envy_bios_print_spreadspectrum(bios,_stdout,mask);
    envy_bios_print_extdev(bios,_stdout,mask);
    envy_bios_print_conn(bios,_stdout,mask);
    envy_bios_print_hdtvtt(bios,_stdout,mask);
    envy_bios_print_mux(bios,_stdout,mask);
    envy_bios_print_mem_type(bios,_stdout,mask);
    envy_bios_print_mem_train(bios,_stdout,mask);
    envy_bios_print_mem_train_ptrn(bios,_stdout,mask);
    envy_bios_print_mem_unk0d(bios,_stdout,mask);
    envy_bios_print_power_therm_devices(bios,_stdout,mask);
    envy_bios_print_power_fan_calib(bios,_stdout,mask);
    envy_bios_print_power_unk1c(bios,_stdout,mask);
    envy_bios_print_power_unk24(bios,_stdout,mask);
    envy_bios_print_power_sense(bios,_stdout,mask);
    envy_bios_print_power_budget(bios,_stdout,mask);
    envy_bios_print_power_boost(bios,_stdout,mask);
    envy_bios_print_power_cstep(bios,_stdout,mask);
    envy_bios_print_power_base_clock(bios,_stdout,mask);
    envy_bios_print_power_unk3c(bios,_stdout,mask);
    envy_bios_print_power_unk40(bios,_stdout,mask);
    envy_bios_print_power_unk44(bios,_stdout,mask);
    envy_bios_print_power_unk48(bios,_stdout,mask);
    envy_bios_print_power_unk4c(bios,_stdout,mask);
    envy_bios_print_power_unk50(bios,_stdout,mask);
    envy_bios_print_power_unk54(bios,_stdout,mask);
    envy_bios_print_power_fan(bios,_stdout,mask);
    envy_bios_print_power_fan_mgmt(bios,_stdout,mask);
    envy_bios_print_power_unk60(bios,_stdout,mask);
    envy_bios_print_power_unk64(bios,_stdout,mask);
    envy_bios_print_power_unk68(bios,_stdout,mask);
    envy_bios_print_power_unk6c(bios,_stdout,mask);
    envy_bios_print_power_unk70(bios,_stdout,mask);
    envy_bios_print_power_unk74(bios,_stdout,mask);
    envy_bios_print_power_unk78(bios,_stdout,mask);
    envy_bios_print_power_unk7c(bios,_stdout,mask);
    envy_bios_print_power_unk80(bios,_stdout,mask);
    envy_bios_print_power_unk84(bios,_stdout,mask);
    envy_bios_print_power_unk88(bios,_stdout,mask);
    envy_bios_print_power_unk8c(bios,_stdout,mask);
    envy_bios_print_power_unk90(bios,_stdout,mask);
    envy_bios_print_power_unk94(bios,_stdout,mask);
    envy_bios_print_power_unk98(bios,_stdout,mask);
    envy_bios_print_D_unk2(bios,_stdout,mask);
    envy_bios_print_L_unk0(bios,_stdout,mask);
    envy_bios_print_T_tmds_info(bios,_stdout,mask);
    envy_bios_print_d_dp_info(bios,_stdout,mask);
    envy_bios_print_p_falcon_ucode(bios,_stdout,mask);
  }
  if ((mask & 0x20000000) != 0) {
    qsort(bios->blocks,(long)bios->blocksnum,0x18,block_cmp);
    end = 0;
    for (start = 0; (int)start < bios->blocksnum; start = start + 1) {
      uVar1 = bios->blocks[(int)start].start;
      uVar2 = uVar1 + bios->blocks[(int)start].len;
      if (end < uVar1) {
        fprintf((FILE *)out,"0x%08x:0x%08x ???\n",(ulong)end,(ulong)uVar1);
        envy_bios_dump_hex(bios,out,end,uVar1 - end,mask);
      }
      if (uVar1 < end) {
        fprintf((FILE *)out,"overlap detected!\n");
      }
      fprintf((FILE *)out,"0x%08x:0x%08x %s",(ulong)uVar1,(ulong)uVar2,bios->blocks[(int)start].name
             );
      if (bios->blocks[(int)start].idx != -1) {
        iVar3 = strcmp(bios->blocks[(int)start].name,"BIT");
        if (iVar3 == 0) {
          fprintf((FILE *)out," \'%c\'",(ulong)(uint)bios->blocks[(int)start].idx);
        }
        else {
          fprintf((FILE *)out,"[%d]",(ulong)(uint)bios->blocks[(int)start].idx);
        }
      }
      fprintf((FILE *)out,"\n");
      end = uVar2;
    }
    fprintf((FILE *)out,"\n");
  }
  return;
}

Assistant:

void envy_bios_print (struct envy_bios *bios, FILE *out, unsigned mask) {
	print_pcir(bios, out, mask);
	switch (bios->type) {
	case ENVY_BIOS_TYPE_UNKNOWN:
		if (mask & ENVY_BIOS_PRINT_VERSION)
			fprintf(out, "BIOS type: UNKNOWN!\n\n");
		break;
	case ENVY_BIOS_TYPE_NV01:
		if (mask & ENVY_BIOS_PRINT_VERSION)
			fprintf(out, "BIOS type: NV01\n\n");
		if (mask & ENVY_BIOS_PRINT_SCRIPTS) {
			/* XXX: how to find these properly? */
			fprintf(out, "Pre-mem scripts:\n\n");
			print_nv01_init_script(bios, out, 0x17bc, mask);
			print_nv01_init_script(bios, out, 0x17a2, mask);
			print_nv01_init_script(bios, out, 0x18f4, mask);
			fprintf(out, "1MB script:\n\n");
			print_nv01_init_script(bios, out, 0x199a, mask);
			fprintf(out, "2MB script:\n\n");
			print_nv01_init_script(bios, out, 0x19db, mask);
			fprintf(out, "4MB script:\n\n");
			print_nv01_init_script(bios, out, 0x1a1c, mask);
			fprintf(out, "Post-mem scripts:\n\n");
			print_nv01_init_script(bios, out, 0x198d, mask);
			print_nv01_init_script(bios, out, 0x1929, mask);
			fprintf(out, "Unknown scripts:\n\n");
			print_nv01_init_script(bios, out, 0x184f, mask);
		}
		break;
	case ENVY_BIOS_TYPE_NV03:
		if (mask & ENVY_BIOS_PRINT_VERSION)
			fprintf(out, "BIOS type: NV03\n\n");
		if (mask & ENVY_BIOS_PRINT_HWINFO) {
			fprintf(out, "Subsystem id: 0x%04x:0x%04x\n", bios->subsystem_vendor, bios->subsystem_device);
			envy_bios_dump_hex(bios, out, 0x54, 4, mask);
			fprintf(out, "\n");
		}
		print_bmp_nv03(bios, out, mask);
		if (bios->init_script)
			print_nv01_init_script(bios, out, bios->init_script, mask);
		break;
	case ENVY_BIOS_TYPE_NV04:
		if (mask & ENVY_BIOS_PRINT_VERSION)
			fprintf(out, "BIOS type: NV04\n\n");
		if (mask & ENVY_BIOS_PRINT_HWINFO) {
			fprintf(out, "Subsystem id: 0x%04x:0x%04x\n", bios->subsystem_vendor, bios->subsystem_device);
			envy_bios_dump_hex(bios, out, 0x54, 4, mask);
			if (bios->hwinfo_ext_valid) {
				fprintf(out, "Straps 0: select 0x%08x value 0x%08x\n", bios->straps0_select, bios->straps0_value);
				fprintf(out, "Straps 1: select 0x%08x value 0x%08x\n", bios->straps1_select, bios->straps1_value);
				envy_bios_dump_hex(bios, out, 0x58, 0x14, mask);
				int i, j;
				for (i = 0; i < bios->mmioinitsnum; i++) {
					fprintf(out, "Addr 0x%08x len %d\n", bios->mmioinits[i].addr, bios->mmioinits[i].len);
					for (j = 0; j < bios->mmioinits[i].len; j++)
						fprintf(out, "\tR[0x%08x] <= 0x%08x\n", bios->mmioinits[i].addr + j * 4, bios->mmioinits[i].data[j]);
				}
				envy_bios_dump_hex(bios, out, bios->mmioinit_offset, bios->mmioinit_len, mask);
			}
			fprintf(out, "\n");
			if (bios->hwea_offset) {
				fprintf(out, "HWEA at 0x%04x:\n", bios->hwea_offset);
				int i, j;
				for (i = 0; i < bios->hwea_entriesnum; i++) {
					struct envy_bios_hwea_entry *entry = &bios->hwea_entries[i];
					if (bios->hwea_version == 0) {
						for (j = 0; j < entry->len; j++) {
							fprintf(out, "\t");
							switch (entry->type) {
								case 0:
									fprintf(out, "C");
									break;
								case 1:
									fprintf(out, "D");
									break;
								default:
									fprintf(out, "UNK%02X", entry->type);
									break;
							}
							fprintf(out, "[0x%04x] <= 0x%08x\n", entry->base + j * 4, entry->data[j]);
						}
					} else {
						if (entry->type < 2) {
							for (j = 0; j < entry->len; j++) {
								fprintf(out, "\tR[0x%06x] <= 0x%08x\n", entry->base + j * 4 * !entry->type, entry->data[j]);
							}
						} else {
							fprintf(out, "\tR[0x%06x] &= 0x%08x |= 0x%08x\n", entry->base, entry->data[0], entry->data[1]);
						}
					}
				}
				envy_bios_dump_hex(bios, out, bios->hwea_offset, bios->hwea_len, mask);
				fprintf(out, "\n");
			}
		}
		envy_bios_print_bit(bios, stdout, mask);
		envy_bios_print_info(bios, stdout, mask);
		envy_bios_print_bit_P(bios, stdout, mask);
		envy_bios_print_bit_M(bios, stdout, mask);
		envy_bios_print_bit_D(bios, stdout, mask);
		envy_bios_print_bit_L(bios, stdout, mask);
		envy_bios_print_bit_T(bios, stdout, mask);
		envy_bios_print_bit_d(bios, stdout, mask);
		envy_bios_print_bit_p(bios, stdout, mask);

		envy_bios_print_dacload(bios, stdout, mask);
		envy_bios_print_iunk21(bios, stdout, mask);
		envy_bios_print_i2cscript(bios, stdout, mask);

		envy_bios_print_dcb(bios, stdout, mask);
		envy_bios_print_odcb(bios, stdout, mask);
		envy_bios_print_i2c(bios, stdout, mask);
		envy_bios_print_gpio(bios, stdout, mask);
		envy_bios_print_inputdev(bios, stdout, mask);
		envy_bios_print_cinema(bios, stdout, mask);
		envy_bios_print_spreadspectrum(bios, stdout, mask);
		envy_bios_print_extdev(bios, stdout, mask);
		envy_bios_print_conn(bios, stdout, mask);
		envy_bios_print_hdtvtt(bios, stdout, mask);
		envy_bios_print_mux(bios, stdout, mask);

		envy_bios_print_mem_type(bios, stdout, mask);
		envy_bios_print_mem_train(bios, stdout, mask);
		envy_bios_print_mem_train_ptrn(bios, stdout, mask);
		envy_bios_print_mem_unk0d(bios, stdout, mask);

		envy_bios_print_power_therm_devices(bios, stdout, mask);
		envy_bios_print_power_fan_calib(bios, stdout, mask);
		envy_bios_print_power_unk1c(bios, stdout, mask);
		envy_bios_print_power_unk24(bios, stdout, mask);
		envy_bios_print_power_sense(bios, stdout, mask);
		envy_bios_print_power_budget(bios, stdout, mask);
		envy_bios_print_power_boost(bios, stdout, mask);
		envy_bios_print_power_cstep(bios, stdout, mask);
		envy_bios_print_power_base_clock(bios, stdout, mask);
		envy_bios_print_power_unk3c(bios, stdout, mask);
		envy_bios_print_power_unk40(bios, stdout, mask);
		envy_bios_print_power_unk44(bios, stdout, mask);
		envy_bios_print_power_unk48(bios, stdout, mask);
		envy_bios_print_power_unk4c(bios, stdout, mask);
		envy_bios_print_power_unk50(bios, stdout, mask);
		envy_bios_print_power_unk54(bios, stdout, mask);
		envy_bios_print_power_fan(bios, stdout, mask);
		envy_bios_print_power_fan_mgmt(bios, stdout, mask);
		envy_bios_print_power_unk60(bios, stdout, mask);
		envy_bios_print_power_unk64(bios, stdout, mask);
		envy_bios_print_power_unk68(bios, stdout, mask);
		envy_bios_print_power_unk6c(bios, stdout, mask);
		envy_bios_print_power_unk70(bios, stdout, mask);
		envy_bios_print_power_unk74(bios, stdout, mask);
		envy_bios_print_power_unk78(bios, stdout, mask);
		envy_bios_print_power_unk7c(bios, stdout, mask);
		envy_bios_print_power_unk80(bios, stdout, mask);
		envy_bios_print_power_unk84(bios, stdout, mask);
		envy_bios_print_power_unk88(bios, stdout, mask);
		envy_bios_print_power_unk8c(bios, stdout, mask);
		envy_bios_print_power_unk90(bios, stdout, mask);
		envy_bios_print_power_unk94(bios, stdout, mask);
		envy_bios_print_power_unk98(bios, stdout, mask);

		envy_bios_print_D_unk2(bios, stdout, mask);

		envy_bios_print_L_unk0(bios, stdout, mask);

		envy_bios_print_T_tmds_info(bios, stdout, mask);

		envy_bios_print_d_dp_info(bios, stdout, mask);

		envy_bios_print_p_falcon_ucode(bios, stdout, mask);
		break;
	}
	if (mask & ENVY_BIOS_PRINT_BLOCKS) {
		qsort(bios->blocks, bios->blocksnum, sizeof *bios->blocks, block_cmp);
		int i;
		unsigned last = 0;
		for (i = 0; i < bios->blocksnum; i++) {
			unsigned start = bios->blocks[i].start;
			unsigned end = start + bios->blocks[i].len;
			if (start > last) {
				fprintf(out, "0x%08x:0x%08x ???\n", last, start);
				envy_bios_dump_hex(bios, out, last, (start - last), mask);
			}
			if (start < last) {
				fprintf(out, "overlap detected!\n");
			}
			fprintf(out, "0x%08x:0x%08x %s", start, end, bios->blocks[i].name);
			if (bios->blocks[i].idx != -1) {
				if (!strcmp(bios->blocks[i].name, "BIT"))
					fprintf(out, " '%c'", bios->blocks[i].idx);
				else
					fprintf(out, "[%d]", bios->blocks[i].idx);
			}
			fprintf(out, "\n");
			last = end;
		}
		fprintf(out, "\n");
	}
}